

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtrace.c
# Opt level: O0

int libtest_debug_cb(CURL *handle,curl_infotype type,uchar *data,size_t size,void *userp)

{
  time_t tVar1;
  tm *ptVar2;
  timeval tVar3;
  long local_a0;
  __suseconds_t local_98;
  tm *now;
  time_t secs;
  char *timestr;
  char timebuf [20];
  timeval tv;
  char *text;
  libtest_trace_cfg *trace_cfg;
  void *userp_local;
  size_t size_local;
  uchar *data_local;
  curl_infotype type_local;
  CURL *handle_local;
  
  timestr._0_1_ = 0;
  secs = (time_t)&timestr;
  if (*userp != 0) {
    tVar3 = tutil_tvnow();
    local_a0 = tVar3.tv_sec;
    local_98 = tVar3.tv_usec;
    if (known_offset == 0) {
      tVar1 = time((time_t *)0x0);
      epoch_offset = tVar1 - local_a0;
      known_offset = 1;
    }
    now = (tm *)(epoch_offset + local_a0);
    ptVar2 = localtime((time_t *)&now);
    curl_msnprintf(&timestr,0x14,"%02d:%02d:%02d.%06ld ",ptVar2->tm_hour,ptVar2->tm_min,
                   ptVar2->tm_sec,local_98);
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"%s== Info: %s",secs,data);
    return 0;
  case CURLINFO_HEADER_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_113e;
    break;
  case CURLINFO_HEADER_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_10fc;
    break;
  case CURLINFO_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_1148;
    break;
  case CURLINFO_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_1112;
    break;
  case CURLINFO_SSL_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_1152;
    break;
  case CURLINFO_SSL_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_1128;
    break;
  default:
    goto switchD_00103301_default;
  }
  libtest_debug_dump((char *)&timestr,(char *)tv.tv_usec,_stderr,data,size,*(int *)((long)userp + 4)
                    );
switchD_00103301_default:
  return 0;
}

Assistant:

int libtest_debug_cb(CURL *handle, curl_infotype type,
                     unsigned char *data, size_t size,
                     void *userp)
{

  struct libtest_trace_cfg *trace_cfg = userp;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  char *timestr;
  time_t secs;

  (void)handle;

  timebuf[0] = '\0';
  timestr = &timebuf[0];

  if(trace_cfg->tracetime) {
    struct tm *now;
    tv = tutil_tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    msnprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
              now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "%s== Info: %s", timestr, (char *)data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  libtest_debug_dump(timebuf, text, stderr, data, size, trace_cfg->nohex);
  return 0;
}